

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniquestring.c
# Opt level: O0

char * unique_string(char *s)

{
  HashErr HVar1;
  size_t sVar2;
  char *__dest;
  char *newp;
  char *p;
  SymbolInfo si;
  char *s_local;
  
  si = (SymbolInfo)s;
  HVar1 = lookup_symbol(sym,s,(SymbolInfo *)&p,&newp);
  if (HVar1 != HASH_NOERR) {
    sVar2 = strlen((char *)si.p);
    __dest = (char *)malloc(sVar2 + 1);
    if (__dest == (char *)0x0) {
      __assert_fail("newp",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/autc04[P]syn68k/syngen/uniquestring.c"
                    ,0x1e,"const char *unique_string(const char *)");
    }
    strcpy(__dest,(char *)si.p);
    insert_symbol(sym,__dest,(SymbolInfo)p);
    newp = __dest;
  }
  return newp;
}

Assistant:

const char *
unique_string (const char *s)
{
  SymbolInfo si;
  const char *p;

  if (lookup_symbol (sym, s, &si, &p) != HASH_NOERR)
    {
      char *newp;

      newp = malloc (strlen (s) + 1);
      assert(newp);
      strcpy (newp, s);
      insert_symbol (sym, newp, si);
      p = newp;
    }

  return p;
}